

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp-mpiu.c
# Opt level: O3

size_t MPIU_Segmenter_collect_sizes(size_t localsize,size_t *sizes,size_t *myoffset,MPI_Comm comm)

{
  long lVar1;
  size_t sVar2;
  size_t totalsize;
  int NTask;
  int ThisTask;
  size_t local_38;
  undefined1 local_30 [4];
  int local_2c;
  
  MPI_Comm_size(comm,local_30);
  MPI_Comm_rank(comm,&local_2c);
  sizes[local_2c] = localsize;
  MPI_Allreduce(sizes + local_2c,&local_38,1,&ompi_mpi_long,&ompi_mpi_op_sum,comm);
  MPI_Allgather(1,0,&ompi_mpi_datatype_null,sizes,1,&ompi_mpi_long,comm);
  *myoffset = 0;
  if (0 < (long)local_2c) {
    lVar1 = 0;
    sVar2 = 0;
    do {
      sVar2 = sVar2 + sizes[lVar1];
      *myoffset = sVar2;
      lVar1 = lVar1 + 1;
    } while (local_2c != lVar1);
  }
  return local_38;
}

Assistant:

size_t
MPIU_Segmenter_collect_sizes(size_t localsize, size_t * sizes, size_t * myoffset, MPI_Comm comm)
{

    int ThisTask, NTask;

    MPI_Comm_size(comm, &NTask);
    MPI_Comm_rank(comm, &ThisTask);

    size_t totalsize;

    sizes[ThisTask] = localsize;

    MPI_Datatype MPI_PTRDIFFT;

    if(sizeof(ptrdiff_t) == sizeof(long)) {
        MPI_PTRDIFFT = MPI_LONG;
    } else if(sizeof(ptrdiff_t) == sizeof(int)) {
        MPI_PTRDIFFT = MPI_INT;
    } else { abort(); }

    MPI_Allreduce(&sizes[ThisTask], &totalsize, 1, MPI_PTRDIFFT, MPI_SUM, comm);
    MPI_Allgather(MPI_IN_PLACE, 0, MPI_DATATYPE_NULL, sizes, 1, MPI_PTRDIFFT, comm);

    int i;
    *myoffset = 0;
    for(i = 0; i < ThisTask; i ++) {
        (*myoffset) += sizes[i];
    }

    return totalsize;
}